

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.h
# Opt level: O3

cmList * __thiscall
cmList::remove_items<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
          (cmList *this,__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> first,
          __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> last)

{
  cmList *pcVar1;
  allocator_type local_29;
  void *local_28 [2];
  long local_18;
  
  std::vector<long,std::allocator<long>>::
  vector<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,void>
            ((vector<long,std::allocator<long>> *)local_28,first,last,&local_29);
  pcVar1 = RemoveItems(this,(vector<long,_std::allocator<long>_> *)local_28);
  if (local_28[0] != (void *)0x0) {
    operator_delete(local_28[0],local_18 - (long)local_28[0]);
  }
  return pcVar1;
}

Assistant:

cmList& remove_items(InputIterator first, InputIterator last)
  {
    return this->RemoveItems(
      std::vector<typename InputIterator::value_type>{ first, last });
  }